

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

FlagBase * __thiscall args::FlagBase::Match(FlagBase *this,EitherFlag *flag)

{
  bool bVar1;
  Options OVar2;
  ostream *poVar3;
  ExtraError *this_00;
  string local_1e8;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream problem;
  EitherFlag *flag_local;
  FlagBase *this_local;
  
  bVar1 = Matcher::Match(&this->matcher,flag);
  if (bVar1) {
    OVar2 = Base::GetOptions((Base *)this);
    OVar2 = operator&(OVar2,Single);
    if ((OVar2 != None) && (((this->super_NamedBase).super_Base.matched & 1U) != 0)) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      poVar3 = std::operator<<((ostream *)local_198,"Flag \'");
      EitherFlag::str_abi_cxx11_(&local_1c8,flag);
      poVar3 = std::operator<<(poVar3,(string *)&local_1c8);
      std::operator<<(poVar3,"\' was passed multiple times, but is only allowed to be passed once");
      std::__cxx11::string::~string((string *)&local_1c8);
      this_00 = (ExtraError *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      ExtraError::ExtraError(this_00,&local_1e8);
      __cxa_throw(this_00,&ExtraError::typeinfo,ExtraError::~ExtraError);
    }
    (this->super_NamedBase).super_Base.matched = true;
    this_local = this;
  }
  else {
    this_local = (FlagBase *)0x0;
  }
  return this_local;
}

Assistant:

virtual FlagBase *Match(const EitherFlag &flag) override
            {
                if (matcher.Match(flag))
                {
                    if ((GetOptions() & Options::Single) != Options::None && matched)
                    {
                        std::ostringstream problem;
                        problem << "Flag '" << flag.str() << "' was passed multiple times, but is only allowed to be passed once";
#ifdef ARGS_NOEXCEPT
                        error = Error::Extra;
                        errorMsg = problem.str();
#else
                        throw ExtraError(problem.str());
#endif
                    }
                    matched = true;
                    return this;
                }
                return nullptr;
            }